

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

int sys_argparse(int argc,char **argv)

{
  int iVar1;
  t_namelist *ptVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  float local_98;
  int local_94;
  float f;
  int devn_5;
  int devn_4;
  int devn_3;
  int devn_2;
  int devn_1;
  int devn;
  t_audiosettings as;
  char **argv_local;
  int argc_local;
  
  as._92_8_ = argv;
  sys_get_audio_settings((t_audiosettings *)&devn_1);
  argv_local._0_4_ = argc;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  while( true ) {
                                    while( true ) {
                                      while( true ) {
                                        while( true ) {
                                          while( true ) {
                                            while( true ) {
                                              while( true ) {
                                                while( true ) {
                                                  while( true ) {
                                                    while( true ) {
                                                      while( true ) {
                                                        while( true ) {
                                                          while( true ) {
                                                            while( true ) {
                                                              while( true ) {
                                                                while( true ) {
                                                                  while( true ) {
                                                                    while( true ) {
                                                                      while( true ) {
                                                                        while( true ) {
                                                                          while( true ) {
                                                                            while( true ) {
                                                                              while( true ) {
                                                                                bVar4 = false;
                                                                                if (0 < (int)
                                                  argv_local) {
                                                    bVar4 = **(char **)as._92_8_ == '-';
                                                  }
                                                  if (!bVar4) {
                                                    if (sys_batch != 0) {
                                                      sys_dontstartgui = 1;
                                                    }
                                                    if (sys_dontstartgui != 0) {
                                                      sys_printtostderr = 1;
                                                    }
                                                    if (sys_defaultfont == 0) {
                                                      sys_defaultfont = 0xc;
                                                    }
                                                    for (; 0 < (int)argv_local;
                                                        argv_local._0_4_ = (int)argv_local + -1) {
                                                      sys_openlist = namelist_append_files
                                                                               (sys_openlist,
                                                                                *(char **)as._92_8_)
                                                      ;
                                                      as._92_8_ = as._92_8_ + 8;
                                                    }
                                                    sys_set_audio_settings
                                                              ((t_audiosettings *)&devn_1);
                                                    return 0;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-r");
                                                  if (((iVar1 != 0) || ((int)argv_local < 2)) ||
                                                     (iVar1 = __isoc99_sscanf(*(undefined8 *)
                                                                               (as._92_8_ + 8),"%d",
                                                                              as.a_choutdevvec + 2),
                                                     iVar1 < 1)) break;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-inchannels");
                                                  if (iVar1 != 0) break;
                                                  if (((int)argv_local < 2) ||
                                                     (iVar1 = sys_parsedevlist(as.a_indevvec + 2,
                                                                               as.a_indevvec + 3,4,
                                                                               *(char **)(as._92_8_
                                                                                         + 8)),
                                                     iVar1 == 0)) goto LAB_001ae793;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-outchannels")
                                                  ;
                                                  if (iVar1 != 0) break;
                                                  if (((int)argv_local < 2) ||
                                                     (iVar1 = sys_parsedevlist(as.a_outdevvec + 2,
                                                                               as.a_outdevvec + 3,4,
                                                                               *(char **)(as._92_8_
                                                                                         + 8)),
                                                     iVar1 == 0)) goto LAB_001ae793;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-channels");
                                                  if (iVar1 != 0) break;
                                                  if ((((int)argv_local < 2) ||
                                                      (iVar1 = sys_parsedevlist(as.a_indevvec + 2,
                                                                                as.a_indevvec + 3,4,
                                                                                *(char **)(as._92_8_
                                                                                          + 8)),
                                                      iVar1 == 0)) ||
                                                     (iVar1 = sys_parsedevlist(as.a_outdevvec + 2,
                                                                               as.a_outdevvec + 3,4,
                                                                               *(char **)(as._92_8_
                                                                                         + 8)),
                                                     iVar1 == 0)) goto LAB_001ae793;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-soundbuf");
                                                  if ((iVar1 != 0) &&
                                                     (iVar1 = strcmp(*(char **)as._92_8_,"-audiobuf"
                                                                    ), iVar1 != 0)) break;
                                                  if ((int)argv_local < 2) goto LAB_001ae793;
                                                  as.a_choutdevvec[3] =
                                                       atoi(*(char **)(as._92_8_ + 8));
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-callback");
                                                  if (iVar1 != 0) break;
                                                  as.a_srate = 1;
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-nocallback");
                                                  if (iVar1 != 0) break;
                                                  as.a_srate = 0;
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-blocksize");
                                                  if (iVar1 != 0) break;
                                                  as.a_advance = atoi(*(char **)(as._92_8_ + 8));
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-sleepgrain");
                                                  if (iVar1 != 0) break;
                                                  if ((int)argv_local < 2) goto LAB_001ae793;
                                                  dVar5 = atof(*(char **)(as._92_8_ + 8));
                                                  sys_sleepgrain = (int)(dVar5 * 1000.0);
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-nodac");
                                                  if (iVar1 != 0) break;
                                                  as.a_outdevvec[2] = 0;
                                                  as.a_chindevvec[2] = 0;
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-noadc");
                                                  if (iVar1 != 0) break;
                                                  as.a_indevvec[2] = 0;
                                                  devn = 0;
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-nosound");
                                                  if ((iVar1 != 0) &&
                                                     (iVar1 = strcmp(*(char **)as._92_8_,"-noaudio")
                                                     , iVar1 != 0)) break;
                                                  as.a_indevvec[2] = 0;
                                                  devn = 0;
                                                  as.a_outdevvec[2] = 0;
                                                  as.a_chindevvec[2] = 0;
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-oss");
                                                  if ((iVar1 != 0) &&
                                                     (iVar1 = strcmp(*(char **)as._92_8_,"-ossmidi")
                                                     , iVar1 != 0)) break;
                                                  fprintf(_stderr,
                                                  "Pd compiled without OSS-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-alsa");
                                                  if ((iVar1 != 0) &&
                                                     (iVar1 = strcmp(*(char **)as._92_8_,"-alsamidi"
                                                                    ), iVar1 != 0)) break;
                                                  fprintf(_stderr,
                                                  "Pd compiled without ALSA-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-alsaadd");
                                                  if (iVar1 != 0) break;
                                                  if ((int)argv_local < 2) goto LAB_001ae793;
                                                  fprintf(_stderr,
                                                  "Pd compiled without ALSA-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  }
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-jack");
                                                  if (((iVar1 != 0) &&
                                                      (iVar1 = strcmp(*(char **)as._92_8_,
                                                                      "-jackconnect"), iVar1 != 0))
                                                     && (iVar1 = strcmp(*(char **)as._92_8_,
                                                                        "-nojackconnect"),
                                                        iVar1 != 0)) break;
                                                  fprintf(_stderr,
                                                  "Pd compiled without JACK-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                                  argv_local._0_4_ = (int)argv_local + -1;
                                                  as._92_8_ = as._92_8_ + 8;
                                                }
                                                iVar1 = strcmp(*(char **)as._92_8_,"-jackname");
                                                if (iVar1 != 0) break;
                                                if ((int)argv_local < 2) goto LAB_001ae793;
                                                fprintf(_stderr,
                                                  "Pd compiled without JACK-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                                argv_local._0_4_ = (int)argv_local + -2;
                                                as._92_8_ = as._92_8_ + 0x10;
                                              }
                                              iVar1 = strcmp(*(char **)as._92_8_,"-pa");
                                              if ((iVar1 != 0) &&
                                                 (iVar1 = strcmp(*(char **)as._92_8_,"-portaudio"),
                                                 iVar1 != 0)) break;
                                              fprintf(_stderr,
                                                  "Pd compiled without PortAudio-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                              argv_local._0_4_ = (int)argv_local + -1;
                                              as._92_8_ = as._92_8_ + 8;
                                            }
                                            iVar1 = strcmp(*(char **)as._92_8_,"-asio");
                                            if (iVar1 != 0) break;
                                            fprintf(_stderr,
                                                  "Pd compiled without ASIO-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                            argv_local._0_4_ = (int)argv_local + -2;
                                            as._92_8_ = as._92_8_ + 0x10;
                                          }
                                          iVar1 = strcmp(*(char **)as._92_8_,"-mmio");
                                          if (iVar1 != 0) break;
                                          fprintf(_stderr,
                                                  "Pd compiled without MMIO-support, ignoring \'%s\' flag\n"
                                                  ,*(undefined8 *)as._92_8_);
                                          argv_local._0_4_ = (int)argv_local + -1;
                                          as._92_8_ = as._92_8_ + 8;
                                        }
                                        iVar1 = strcmp(*(char **)as._92_8_,"-audiounit");
                                        if (iVar1 != 0) break;
                                        fprintf(_stderr,
                                                "Pd compiled without AudioUnit-support, ignoring \'%s\' flag\n"
                                                ,*(undefined8 *)as._92_8_);
                                        argv_local._0_4_ = (int)argv_local + -1;
                                        as._92_8_ = as._92_8_ + 8;
                                      }
                                      iVar1 = strcmp(*(char **)as._92_8_,"-esd");
                                      if (iVar1 != 0) break;
                                      fprintf(_stderr,
                                              "Pd compiled without ESD-support, ignoring \'%s\' flag\n"
                                              ,*(undefined8 *)as._92_8_);
                                      argv_local._0_4_ = (int)argv_local + -1;
                                      as._92_8_ = as._92_8_ + 8;
                                    }
                                    iVar1 = strcmp(*(char **)as._92_8_,"-listdev");
                                    if (iVar1 != 0) break;
                                    sys_listplease = 1;
                                    argv_local._0_4_ = (int)argv_local + -1;
                                    as._92_8_ = as._92_8_ + 8;
                                  }
                                  iVar1 = strcmp(*(char **)as._92_8_,"-soundindev");
                                  if ((iVar1 != 0) &&
                                     (iVar1 = strcmp(*(char **)as._92_8_,"-audioindev"), iVar1 != 0)
                                     ) break;
                                  if (((int)argv_local < 2) ||
                                     (iVar1 = sys_parsedevlist(&devn,&as.a_api,4,
                                                               *(char **)(as._92_8_ + 8)),
                                     iVar1 == 0)) goto LAB_001ae793;
                                  argv_local._0_4_ = (int)argv_local + -2;
                                  as._92_8_ = as._92_8_ + 0x10;
                                }
                                iVar1 = strcmp(*(char **)as._92_8_,"-soundoutdev");
                                if ((iVar1 != 0) &&
                                   (iVar1 = strcmp(*(char **)as._92_8_,"-audiooutdev"), iVar1 != 0))
                                break;
                                if (((int)argv_local < 2) ||
                                   (iVar1 = sys_parsedevlist(as.a_chindevvec + 2,as.a_chindevvec + 3
                                                             ,4,*(char **)(as._92_8_ + 8)),
                                   iVar1 == 0)) goto LAB_001ae793;
                                argv_local._0_4_ = (int)argv_local + -2;
                                as._92_8_ = as._92_8_ + 0x10;
                              }
                              iVar1 = strcmp(*(char **)as._92_8_,"-sounddev");
                              if ((iVar1 != 0) &&
                                 (iVar1 = strcmp(*(char **)as._92_8_,"-audiodev"), iVar1 != 0))
                              break;
                              if ((((int)argv_local < 2) ||
                                  (iVar1 = sys_parsedevlist(&devn,&as.a_api,4,
                                                            *(char **)(as._92_8_ + 8)), iVar1 == 0))
                                 || (iVar1 = sys_parsedevlist(as.a_chindevvec + 2,
                                                              as.a_chindevvec + 3,4,
                                                              *(char **)(as._92_8_ + 8)), iVar1 == 0
                                    )) goto LAB_001ae793;
                              argv_local._0_4_ = (int)argv_local + -2;
                              as._92_8_ = as._92_8_ + 0x10;
                            }
                            iVar1 = strcmp(*(char **)as._92_8_,"-audioaddindev");
                            if (iVar1 != 0) break;
                            if ((int)argv_local < 2) goto LAB_001ae793;
                            if (devn < 0) {
                              devn = 0;
                            }
                            if (devn < 4) {
                              devn_2 = sys_audiodevnametonumber(0,*(char **)(as._92_8_ + 8));
                              if (devn_2 < 0) {
                                fprintf(_stderr,"Couldn\'t find audio input device: %s\n",
                                        *(undefined8 *)(as._92_8_ + 8));
                              }
                              else {
                                as.a_indevvec[(long)devn + -2] = devn_2 + 1;
                                devn = devn + 1;
                              }
                            }
                            else {
                              fprintf(_stderr,"number of audio devices limited to %d\n",4);
                            }
                            argv_local._0_4_ = (int)argv_local + -2;
                            as._92_8_ = as._92_8_ + 0x10;
                          }
                          iVar1 = strcmp(*(char **)as._92_8_,"-audioaddoutdev");
                          if (iVar1 != 0) break;
                          if ((int)argv_local < 2) goto LAB_001ae793;
                          if (as.a_chindevvec[2] < 0) {
                            as.a_chindevvec[2] = 0;
                          }
                          if (as.a_chindevvec[2] < 4) {
                            devn_3 = sys_audiodevnametonumber(1,*(char **)(as._92_8_ + 8));
                            if (devn_3 < 0) {
                              fprintf(_stderr,"Couldn\'t find audio output device: %s\n",
                                      *(undefined8 *)(as._92_8_ + 8));
                            }
                            else {
                              as.a_chindevvec[(long)as.a_chindevvec[2] + 3] = devn_3 + 1;
                              as.a_chindevvec[2] = as.a_chindevvec[2] + 1;
                            }
                          }
                          else {
                            fprintf(_stderr,"number of audio devices limited to %d\n",4);
                          }
                          argv_local._0_4_ = (int)argv_local + -2;
                          as._92_8_ = as._92_8_ + 0x10;
                        }
                        iVar1 = strcmp(*(char **)as._92_8_,"-audioadddev");
                        if (iVar1 != 0) break;
                        if ((int)argv_local < 2) goto LAB_001ae793;
                        if (devn < 0) {
                          devn = 0;
                        }
                        if (as.a_chindevvec[2] < 0) {
                          as.a_chindevvec[2] = 0;
                        }
                        if ((devn < 4) && (as.a_chindevvec[2] < 4)) {
                          devn_4 = sys_audiodevnametonumber(0,*(char **)(as._92_8_ + 8));
                          if (devn_4 < 0) {
                            fprintf(_stderr,"Couldn\'t find audio input device: %s\n",
                                    *(undefined8 *)(as._92_8_ + 8));
                          }
                          else {
                            as.a_indevvec[(long)devn + -2] = devn_4 + 1;
                            devn = devn + 1;
                          }
                          devn_4 = sys_audiodevnametonumber(1,*(char **)(as._92_8_ + 8));
                          if (devn_4 < 0) {
                            fprintf(_stderr,"Couldn\'t find audio output device: %s\n",
                                    *(undefined8 *)(as._92_8_ + 8));
                          }
                          else {
                            as.a_chindevvec[(long)as.a_chindevvec[2] + 3] = devn_4 + 1;
                            as.a_chindevvec[2] = as.a_chindevvec[2] + 1;
                          }
                        }
                        else {
                          fprintf(_stderr,"number of audio devices limited to %d",4);
                        }
                        argv_local._0_4_ = (int)argv_local + -2;
                        as._92_8_ = as._92_8_ + 0x10;
                      }
                      iVar1 = strcmp(*(char **)as._92_8_,"-nomidiin");
                      if (iVar1 != 0) break;
                      sys_nmidiin = 0;
                      argv_local._0_4_ = (int)argv_local + -1;
                      as._92_8_ = as._92_8_ + 8;
                    }
                    iVar1 = strcmp(*(char **)as._92_8_,"-nomidiout");
                    if (iVar1 != 0) break;
                    sys_nmidiout = 0;
                    argv_local._0_4_ = (int)argv_local + -1;
                    as._92_8_ = as._92_8_ + 8;
                  }
                  iVar1 = strcmp(*(char **)as._92_8_,"-nomidi");
                  if (iVar1 != 0) break;
                  sys_nmidiout = 0;
                  sys_nmidiin = 0;
                  argv_local._0_4_ = (int)argv_local + -1;
                  as._92_8_ = as._92_8_ + 8;
                }
                iVar1 = strcmp(*(char **)as._92_8_,"-midiindev");
                if (iVar1 != 0) break;
                if (((int)argv_local < 2) ||
                   (sys_parsedevlist(&sys_nmidiin,sys_midiindevlist,0x10,*(char **)(as._92_8_ + 8)),
                   sys_nmidiin == 0)) goto LAB_001ae793;
                argv_local._0_4_ = (int)argv_local + -2;
                as._92_8_ = as._92_8_ + 0x10;
              }
              iVar1 = strcmp(*(char **)as._92_8_,"-midioutdev");
              if (iVar1 != 0) break;
              if (((int)argv_local < 2) ||
                 (sys_parsedevlist(&sys_nmidiout,sys_midioutdevlist,0x10,*(char **)(as._92_8_ + 8)),
                 sys_nmidiout == 0)) goto LAB_001ae793;
              argv_local._0_4_ = (int)argv_local + -2;
              as._92_8_ = as._92_8_ + 0x10;
            }
            iVar1 = strcmp(*(char **)as._92_8_,"-mididev");
            if (iVar1 != 0) break;
            if ((int)argv_local < 2) goto LAB_001ae793;
            sys_parsedevlist(&sys_nmidiin,sys_midiindevlist,0x10,*(char **)(as._92_8_ + 8));
            sys_parsedevlist(&sys_nmidiout,sys_midioutdevlist,0x10,*(char **)(as._92_8_ + 8));
            if (sys_nmidiout == 0) goto LAB_001ae793;
            argv_local._0_4_ = (int)argv_local + -2;
            as._92_8_ = as._92_8_ + 0x10;
          }
          iVar1 = strcmp(*(char **)as._92_8_,"-midiaddindev");
          if (iVar1 != 0) break;
          if ((int)argv_local < 2) goto LAB_001ae793;
          if (sys_nmidiin < 0) {
            sys_nmidiin = 0;
          }
          if (sys_nmidiin < 0x10) {
            devn_5 = sys_mididevnametonumber(0,*(char **)(as._92_8_ + 8));
            if (devn_5 < 0) {
              fprintf(_stderr,"Couldn\'t find MIDI input device: %s\n",
                      *(undefined8 *)(as._92_8_ + 8));
            }
            else {
              lVar3 = (long)sys_nmidiin;
              sys_nmidiin = sys_nmidiin + 1;
              sys_midiindevlist[lVar3] = devn_5 + 1;
            }
          }
          else {
            fprintf(_stderr,"number of MIDI devices limited to %d\n",0x10);
          }
          argv_local._0_4_ = (int)argv_local + -2;
          as._92_8_ = as._92_8_ + 0x10;
        }
        iVar1 = strcmp(*(char **)as._92_8_,"-midiaddoutdev");
        if (iVar1 != 0) break;
        if ((int)argv_local < 2) goto LAB_001ae793;
        if (sys_nmidiout < 0) {
          sys_nmidiout = 0;
        }
        if (sys_nmidiout < 0x10) {
          f = (float)sys_mididevnametonumber(1,*(char **)(as._92_8_ + 8));
          if ((int)f < 0) {
            fprintf(_stderr,"Couldn\'t find MIDI output device: %s\n",*(undefined8 *)(as._92_8_ + 8)
                   );
          }
          else {
            lVar3 = (long)sys_nmidiout;
            sys_nmidiout = sys_nmidiout + 1;
            sys_midioutdevlist[lVar3] = (int)f + 1;
          }
        }
        else {
          fprintf(_stderr,"number of MIDI devices limited to %d\n",0x10);
        }
        argv_local._0_4_ = (int)argv_local + -2;
        as._92_8_ = as._92_8_ + 0x10;
      }
      iVar1 = strcmp(*(char **)as._92_8_,"-midiadddev");
      if (iVar1 == 0) break;
      iVar1 = strcmp(*(char **)as._92_8_,"-path");
      if (iVar1 == 0) {
        if ((int)argv_local < 2) goto LAB_001ae793;
        ptVar2 = namelist_append_files
                           ((pd_maininstance.pd_stuff)->st_temppath,*(char **)(as._92_8_ + 8));
        (pd_maininstance.pd_stuff)->st_temppath = ptVar2;
        argv_local._0_4_ = (int)argv_local + -2;
        as._92_8_ = as._92_8_ + 0x10;
      }
      else {
        iVar1 = strcmp(*(char **)as._92_8_,"-nostdpath");
        if (iVar1 == 0) {
          sys_usestdpath = 0;
          argv_local._0_4_ = (int)argv_local + -1;
          as._92_8_ = as._92_8_ + 8;
        }
        else {
          iVar1 = strcmp(*(char **)as._92_8_,"-stdpath");
          if (iVar1 == 0) {
            sys_usestdpath = 1;
            argv_local._0_4_ = (int)argv_local + -1;
            as._92_8_ = as._92_8_ + 8;
          }
          else {
            iVar1 = strcmp(*(char **)as._92_8_,"-helppath");
            if (iVar1 == 0) {
              if ((int)argv_local < 2) goto LAB_001ae793;
              ptVar2 = namelist_append_files
                                 ((pd_maininstance.pd_stuff)->st_helppath,*(char **)(as._92_8_ + 8))
              ;
              (pd_maininstance.pd_stuff)->st_helppath = ptVar2;
              argv_local._0_4_ = (int)argv_local + -2;
              as._92_8_ = as._92_8_ + 0x10;
            }
            else {
              iVar1 = strcmp(*(char **)as._92_8_,"-open");
              if (iVar1 == 0) {
                if ((int)argv_local < 2) goto LAB_001ae793;
                sys_openlist = namelist_append_files(sys_openlist,*(char **)(as._92_8_ + 8));
                argv_local._0_4_ = (int)argv_local + -2;
                as._92_8_ = as._92_8_ + 0x10;
              }
              else {
                iVar1 = strcmp(*(char **)as._92_8_,"-lib");
                if (iVar1 == 0) {
                  if ((int)argv_local < 2) goto LAB_001ae793;
                  ptVar2 = namelist_append_files
                                     ((pd_maininstance.pd_stuff)->st_externlist,
                                      *(char **)(as._92_8_ + 8));
                  (pd_maininstance.pd_stuff)->st_externlist = ptVar2;
                  argv_local._0_4_ = (int)argv_local + -2;
                  as._92_8_ = as._92_8_ + 0x10;
                }
                else {
                  iVar1 = strcmp(*(char **)as._92_8_,"-font-size");
                  if ((iVar1 == 0) || (iVar1 = strcmp(*(char **)as._92_8_,"-font"), iVar1 == 0)) {
                    if ((int)argv_local < 2) goto LAB_001ae793;
                    iVar1 = atoi(*(char **)(as._92_8_ + 8));
                    sys_defaultfont = sys_nearestfontsize(iVar1);
                    argv_local._0_4_ = (int)argv_local + -2;
                    as._92_8_ = as._92_8_ + 0x10;
                  }
                  else {
                    iVar1 = strcmp(*(char **)as._92_8_,"-font-face");
                    if ((iVar1 == 0) ||
                       (iVar1 = strcmp(*(char **)as._92_8_,"-typeface"), iVar1 == 0)) {
                      if ((int)argv_local < 2) goto LAB_001ae793;
                      strncpy(sys_font,*(char **)(as._92_8_ + 8),99);
                      sys_font[99] = '\0';
                      argv_local._0_4_ = (int)argv_local + -2;
                      as._92_8_ = as._92_8_ + 0x10;
                    }
                    else {
                      iVar1 = strcmp(*(char **)as._92_8_,"-font-weight");
                      if (iVar1 == 0) {
                        if ((int)argv_local < 2) goto LAB_001ae793;
                        strncpy(sys_fontweight,*(char **)(as._92_8_ + 8),9);
                        sys_fontweight[9] = '\0';
                        argv_local._0_4_ = (int)argv_local + -2;
                        as._92_8_ = as._92_8_ + 0x10;
                      }
                      else {
                        iVar1 = strcmp(*(char **)as._92_8_,"-verbose");
                        if (iVar1 == 0) {
                          sys_verbose = sys_verbose + 1;
                          argv_local._0_4_ = (int)argv_local + -1;
                          as._92_8_ = as._92_8_ + 8;
                        }
                        else {
                          iVar1 = strcmp(*(char **)as._92_8_,"-noverbose");
                          if (iVar1 == 0) {
                            sys_verbose = 0;
                            argv_local._0_4_ = (int)argv_local + -1;
                            as._92_8_ = as._92_8_ + 8;
                          }
                          else {
                            iVar1 = strcmp(*(char **)as._92_8_,"-version");
                            if (iVar1 == 0) {
                              sys_version = 1;
                              argv_local._0_4_ = (int)argv_local + -1;
                              as._92_8_ = as._92_8_ + 8;
                            }
                            else {
                              iVar1 = strcmp(*(char **)as._92_8_,"-d");
                              if (((iVar1 == 0) && (1 < (int)argv_local)) &&
                                 (iVar1 = __isoc99_sscanf(*(undefined8 *)(as._92_8_ + 8),"%d",
                                                          &sys_debuglevel), 0 < iVar1)) {
                                argv_local._0_4_ = (int)argv_local + -2;
                                as._92_8_ = as._92_8_ + 0x10;
                              }
                              else {
                                iVar1 = strcmp(*(char **)as._92_8_,"-loadbang");
                                if (iVar1 == 0) {
                                  sys_noloadbang = 0;
                                  argv_local._0_4_ = (int)argv_local + -1;
                                  as._92_8_ = as._92_8_ + 8;
                                }
                                else {
                                  iVar1 = strcmp(*(char **)as._92_8_,"-noloadbang");
                                  if (iVar1 == 0) {
                                    sys_noloadbang = 1;
                                    argv_local._0_4_ = (int)argv_local + -1;
                                    as._92_8_ = as._92_8_ + 8;
                                  }
                                  else {
                                    iVar1 = strcmp(*(char **)as._92_8_,"-gui");
                                    if (iVar1 == 0) {
                                      sys_dontstartgui = 0;
                                      argv_local._0_4_ = (int)argv_local + -1;
                                      as._92_8_ = as._92_8_ + 8;
                                    }
                                    else {
                                      iVar1 = strcmp(*(char **)as._92_8_,"-nogui");
                                      if (iVar1 == 0) {
                                        sys_dontstartgui = 1;
                                        argv_local._0_4_ = (int)argv_local + -1;
                                        as._92_8_ = as._92_8_ + 8;
                                      }
                                      else {
                                        iVar1 = strcmp(*(char **)as._92_8_,"-guiport");
                                        if (((iVar1 == 0) && (1 < (int)argv_local)) &&
                                           (iVar1 = __isoc99_sscanf(*(undefined8 *)(as._92_8_ + 8),
                                                                    "%d",&sys_guisetportnumber),
                                           0 < iVar1)) {
                                          argv_local._0_4_ = (int)argv_local + -2;
                                          as._92_8_ = as._92_8_ + 0x10;
                                        }
                                        else {
                                          iVar1 = strcmp(*(char **)as._92_8_,"-nostderr");
                                          if (iVar1 == 0) {
                                            sys_printtostderr = 0;
                                            argv_local._0_4_ = (int)argv_local + -1;
                                            as._92_8_ = as._92_8_ + 8;
                                          }
                                          else {
                                            iVar1 = strcmp(*(char **)as._92_8_,"-stderr");
                                            if (iVar1 == 0) {
                                              sys_printtostderr = 1;
                                              argv_local._0_4_ = (int)argv_local + -1;
                                              as._92_8_ = as._92_8_ + 8;
                                            }
                                            else {
                                              iVar1 = strcmp(*(char **)as._92_8_,"-guicmd");
                                              if (iVar1 == 0) {
                                                if ((int)argv_local < 2) goto LAB_001ae793;
                                                sys_guicmd = *(char **)(as._92_8_ + 8);
                                                argv_local._0_4_ = (int)argv_local + -2;
                                                as._92_8_ = as._92_8_ + 0x10;
                                              }
                                              else {
                                                iVar1 = strcmp(*(char **)as._92_8_,"-send");
                                                if (iVar1 == 0) {
                                                  if ((int)argv_local < 2) goto LAB_001ae793;
                                                  sys_messagelist =
                                                       namelist_append(sys_messagelist,
                                                                       *(char **)(as._92_8_ + 8),1);
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                }
                                                else {
                                                  iVar1 = strcmp(*(char **)as._92_8_,"-schedlib");
                                                  if (iVar1 == 0) {
                                                    if ((int)argv_local < 2) goto LAB_001ae793;
                                                    sys_externalschedlib = 1;
                                                    strncpy(sys_externalschedlibname,
                                                            *(char **)(as._92_8_ + 8),999);
                                                    devn_1 = 0;
                                                    as._92_8_ = as._92_8_ + 0x10;
                                                    argv_local._0_4_ = (int)argv_local + -2;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(*(char **)as._92_8_,"-extraflags"
                                                                  );
                                                    if (iVar1 == 0) {
                                                      if ((int)argv_local < 2) goto LAB_001ae793;
                                                      sys_extraflags = 1;
                                                      strncpy(sys_extraflagsstring,
                                                              *(char **)(as._92_8_ + 8),999);
                                                      as._92_8_ = as._92_8_ + 0x10;
                                                      argv_local._0_4_ = (int)argv_local + -2;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(*(char **)as._92_8_,"-batch");
                                                      if (iVar1 == 0) {
                                                        sys_batch = 1;
                                                        argv_local._0_4_ = (int)argv_local + -1;
                                                        as._92_8_ = as._92_8_ + 8;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(*(char **)as._92_8_,
                                                                       "-nobatch");
                                                        if (iVar1 == 0) {
                                                          sys_batch = 0;
                                                          argv_local._0_4_ = (int)argv_local + -1;
                                                          as._92_8_ = as._92_8_ + 8;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(*(char **)as._92_8_,
                                                                         "-autopatch");
                                                          if (iVar1 == 0) {
                                                            sys_noautopatch = 0;
                                                            argv_local._0_4_ = (int)argv_local + -1;
                                                            as._92_8_ = as._92_8_ + 8;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(*(char **)as._92_8_,
                                                                           "-noautopatch");
                                                            if (iVar1 == 0) {
                                                              sys_noautopatch = 1;
                                                              argv_local._0_4_ =
                                                                   (int)argv_local + -1;
                                                              as._92_8_ = as._92_8_ + 8;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(*(char **)as._92_8_,
                                                                             "-compatibility");
                                                              if (iVar1 == 0) {
                                                                if (((int)argv_local < 2) ||
                                                                   (iVar1 = __isoc99_sscanf(*(
                                                  undefined8 *)(as._92_8_ + 8),"%f",&local_98),
                                                  iVar1 < 1)) goto LAB_001ae793;
                                                  pd_compatibilitylevel =
                                                       (int)(local_98 * 100.0 + 0.5);
                                                  as._92_8_ = as._92_8_ + 0x10;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(*(char **)as._92_8_,"-rt");
                                                    if ((iVar1 == 0) ||
                                                       (iVar1 = strcmp(*(char **)as._92_8_,
                                                                       "-realtime"), iVar1 == 0)) {
                                                      sys_hipriority = 1;
                                                      argv_local._0_4_ = (int)argv_local + -1;
                                                      as._92_8_ = as._92_8_ + 8;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(*(char **)as._92_8_,"-nrt");
                                                      if (((iVar1 == 0) ||
                                                          (iVar1 = strcmp(*(char **)as._92_8_,
                                                                          "-nort"), iVar1 == 0)) ||
                                                         (iVar1 = strcmp(*(char **)as._92_8_,
                                                                         "-norealtime"), iVar1 == 0)
                                                         ) {
                                                        sys_hipriority = 0;
                                                        argv_local._0_4_ = (int)argv_local + -1;
                                                        as._92_8_ = as._92_8_ + 8;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(*(char **)as._92_8_,"-sleep")
                                                        ;
                                                        if (iVar1 == 0) {
                                                          sys_nosleep = 0;
                                                          argv_local._0_4_ = (int)argv_local + -1;
                                                          as._92_8_ = as._92_8_ + 8;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(*(char **)as._92_8_,
                                                                         "-nosleep");
                                                          if (iVar1 == 0) {
                                                            sys_nosleep = 1;
                                                            argv_local._0_4_ = (int)argv_local + -1;
                                                            as._92_8_ = as._92_8_ + 8;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(*(char **)as._92_8_,
                                                                           "-noprefs");
                                                            if (iVar1 == 0) {
                                                              argv_local._0_4_ =
                                                                   (int)argv_local + -1;
                                                              as._92_8_ = as._92_8_ + 8;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(*(char **)as._92_8_,
                                                                             "-prefsfile");
                                                              if ((iVar1 != 0) ||
                                                                 ((int)argv_local < 2))
                                                              goto LAB_001ae793;
                                                              argv_local._0_4_ =
                                                                   (int)argv_local + -2;
                                                              as._92_8_ = as._92_8_ + 0x10;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((int)argv_local < 2) break;
    if (sys_nmidiin < 0) {
      sys_nmidiin = 0;
    }
    if (sys_nmidiout < 0) {
      sys_nmidiout = 0;
    }
    if ((sys_nmidiin < 0x10) && (sys_nmidiout < 0x10)) {
      local_94 = sys_mididevnametonumber(1,*(char **)(as._92_8_ + 8));
      if (local_94 < 0) {
        fprintf(_stderr,"Couldn\'t find MIDI output device: %s\n",*(undefined8 *)(as._92_8_ + 8));
      }
      else {
        lVar3 = (long)sys_nmidiin;
        sys_nmidiin = sys_nmidiin + 1;
        sys_midioutdevlist[lVar3] = local_94 + 1;
      }
      local_94 = sys_mididevnametonumber(1,*(char **)(as._92_8_ + 8));
      if (local_94 < 0) {
        fprintf(_stderr,"Couldn\'t find MIDI output device: %s\n",*(undefined8 *)(as._92_8_ + 8));
      }
      else {
        lVar3 = (long)sys_nmidiout;
        sys_nmidiout = sys_nmidiout + 1;
        sys_midioutdevlist[lVar3] = local_94 + 1;
      }
    }
    else {
      fprintf(_stderr,"number of MIDI devices limited to %d",0x10);
    }
    argv_local._0_4_ = (int)argv_local + -2;
    as._92_8_ = as._92_8_ + 0x10;
  }
LAB_001ae793:
  sys_printusage();
  return 1;
}

Assistant:

int sys_argparse(int argc, const char **argv)
{
    t_audiosettings as;
            /* get the current audio parameters.  These are set
            by the preferences mechanism (sys_loadpreferences()) or
            else are the default.  Overwrite them with any results
            of argument parsing, and store them again. */
    sys_get_audio_settings(&as);
    while ((argc > 0) && **argv == '-')
    {
                /* audio flags */
        if (!strcmp(*argv, "-r") && argc > 1 &&
            sscanf(argv[1], "%d", &as.a_srate) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-inchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-outchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-channels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundbuf") || (!strcmp(*argv, "-audiobuf")))
        {
            if (argc < 2)
                goto usage;

            as.a_advance = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-callback"))
        {
            as.a_callback = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nocallback"))
        {
            as.a_callback = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-blocksize"))
        {
            as.a_blocksize = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-sleepgrain"))
        {
            if (argc < 2)
                goto usage;
            sys_sleepgrain = 1000 * atof(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nodac"))
        {
            as.a_noutdev = as.a_nchoutdev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noadc"))
        {
            as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosound") || !strcmp(*argv, "-noaudio"))
        {
            as.a_noutdev = as.a_nchoutdev =  as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
#ifdef USEAPI_OSS
        else if (!strcmp(*argv, "-oss"))
        {
            as.a_api = API_OSS;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-ossmidi"))
        {
            sys_set_midi_api(API_OSS);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-oss")) || (!strcmp(*argv, "-ossmidi")))
        {
            fprintf(stderr, "Pd compiled without OSS-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ALSA
        else if (!strcmp(*argv, "-alsa"))
        {
            as.a_api = API_ALSA;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_ALSA;
            alsa_adddev(argv[1]);
            argc -= 2; argv +=2;
        }
        else if (!strcmp(*argv, "-alsamidi"))
        {
            sys_set_midi_api(API_ALSA);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-alsa")) || (!strcmp(*argv, "-alsamidi")))
        {
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_JACK
        else if (!strcmp(*argv, "-jack"))
        {
            as.a_api = API_JACK;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nojackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(0);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(1);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_JACK;
            jack_client_name(argv[1]);
            argc -= 2; argv +=2;
        }
#else
        else if ((!strcmp(*argv, "-jack"))
            || (!strcmp(*argv, "-jackconnect"))
            || (!strcmp(*argv, "-nojackconnect")))
        {
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_PORTAUDIO
        else if (!strcmp(*argv, "-pa") || !strcmp(*argv, "-portaudio")
            || !strcmp(*argv, "-asio"))
        {
            as.a_api = API_PORTAUDIO;
            sys_mmio = 0;
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-pa")) || (!strcmp(*argv, "-portaudio")))
        {
            fprintf(stderr, "Pd compiled without PortAudio-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-asio"))
        {
            fprintf(stderr, "Pd compiled without ASIO-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_MMIO
        else if (!strcmp(*argv, "-mmio"))
        {
            as.a_api = API_MMIO;
            sys_mmio = 1;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-mmio"))
        {
            fprintf(stderr, "Pd compiled without MMIO-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_AUDIOUNIT
        else if (!strcmp(*argv, "-audiounit"))
        {
            as.a_api = API_AUDIOUNIT;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-audiounit"))
        {
            fprintf(stderr, "Pd compiled without AudioUnit-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ESD
        else if (!strcmp(*argv, "-esd"))
        {
            as.a_api = API_ESD;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-esd"))
        {
            fprintf(stderr, "Pd compiled without ESD-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-listdev"))
        {
            sys_listplease = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-soundindev") ||
            !strcmp(*argv, "-audioindev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundoutdev") ||
            !strcmp(*argv, "-audiooutdev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-sounddev") || !strcmp(*argv, "-audiodev")))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_nindev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioadddev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_nindev < MAXAUDIOINDEV && as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
                devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
                /* MIDI flags */
        else if (!strcmp(*argv, "-nomidiin"))
        {
            sys_nmidiin = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidiout"))
        {
            sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidi"))
        {
            sys_nmidiin = sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-midiindev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            if (!sys_nmidiin)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midioutdev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-mididev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiin < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI input device: %s\n",
                        argv[1]);
                else sys_midiindevlist[sys_nmidiin++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiadddev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiin < MAXMIDIINDEV && sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiin++] = devn + 1;
                devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
                /* other flags */
        else if (!strcmp(*argv, "-path"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_temppath =
                namelist_append_files(STUFF->st_temppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nostdpath"))
        {
            sys_usestdpath = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stdpath"))
        {
            sys_usestdpath = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-helppath"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_helppath =
                namelist_append_files(STUFF->st_helppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-open"))
        {
            if (argc < 2)
                goto usage;

            sys_openlist = namelist_append_files(sys_openlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-lib"))
        {
            if (argc < 2)
                goto usage;

            STUFF->st_externlist =
                namelist_append_files(STUFF->st_externlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-font-size") || !strcmp(*argv, "-font")))
        {
            if (argc < 2)
                goto usage;

            sys_defaultfont = sys_nearestfontsize(atoi(argv[1]));
            argc -= 2;
            argv += 2;
        }
        else if ((!strcmp(*argv, "-font-face") || !strcmp(*argv, "-typeface")))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_font,*(argv+1),sizeof(sys_font)-1);
            sys_font[sizeof(sys_font)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-font-weight"))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_fontweight,*(argv+1),sizeof(sys_fontweight)-1);
            sys_fontweight[sizeof(sys_fontweight)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-verbose"))
        {
            sys_verbose++;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noverbose"))
        {
            sys_verbose=0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-version"))
        {
            sys_version = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-d") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_debuglevel) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-loadbang"))
        {
            sys_noloadbang = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noloadbang"))
        {
            sys_noloadbang = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-gui"))
        {
            sys_dontstartgui = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nogui"))
        {
            sys_dontstartgui = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guiport") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_guisetportnumber) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-nostderr"))
        {
            sys_printtostderr = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stderr"))
        {
            sys_printtostderr = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guicmd"))
        {
            if (argc < 2)
                goto usage;

            sys_guicmd = argv[1];
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-send"))
        {
            if (argc < 2)
                goto usage;

            sys_messagelist = namelist_append(sys_messagelist, argv[1], 1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-schedlib"))
        {
            if (argc < 2)
                goto usage;

            sys_externalschedlib = 1;
            strncpy(sys_externalschedlibname, argv[1],
                sizeof(sys_externalschedlibname) - 1);
#ifndef  __APPLE__
                /* no audio I/O please, unless overwritten by later args.
                This is to circumvent a problem running pd~ subprocesses
                with -nogui; they would open an audio device before pdsched.c
                could set the API to nothing.  For some reason though, on
                MACOSX this causes Pd to switch to JACK so we just give up
                and suppress the workaround there. */
            as.a_api = 0;
#endif
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-extraflags"))
        {
            if (argc < 2)
                goto usage;

            sys_extraflags = 1;
            strncpy(sys_extraflagsstring, argv[1],
                sizeof(sys_extraflagsstring) - 1);
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-batch"))
        {
            sys_batch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nobatch"))
        {
            sys_batch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-autopatch"))
        {
            sys_noautopatch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noautopatch"))
        {
            sys_noautopatch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-compatibility"))
        {
            float f;
            if (argc < 2)
                goto usage;

            if (sscanf(argv[1], "%f", &f) < 1)
                goto usage;
            pd_compatibilitylevel = 0.5 + 100. * f; /* e.g., 2.44 --> 244 */
            argv += 2;
            argc -= 2;
        }
#ifdef HAVE_UNISTD_H
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime"))
        {
            sys_hipriority = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort") || !strcmp(*argv, "-norealtime"))
        {
            sys_hipriority = 0;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime")
                 || !strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort")
                 || !strcmp(*argv, "-norealtime"))
        {
            fprintf(stderr, "Pd compiled without realtime priority-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-sleep"))
        {
            sys_nosleep = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosleep"))
        {
            sys_nosleep = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noprefs")) /* did this earlier */
            argc--, argv++;
        else if (!strcmp(*argv, "-prefsfile") && argc > 1) /* this too */
            argc -= 2, argv +=2;
        else
        {
        usage:
            sys_printusage();
            return (1);
        }
    }
    if (sys_batch)
        sys_dontstartgui = 1;
    if (sys_dontstartgui)
        sys_printtostderr = 1;
#ifdef _WIN32
    if (sys_printtostderr)
        /* we need to tell Windows to output UTF-8 */
        SetConsoleOutputCP(CP_UTF8);
#endif
    if (!sys_defaultfont)
        sys_defaultfont = DEFAULTFONT;
    for (; argc > 0; argc--, argv++)
        sys_openlist = namelist_append_files(sys_openlist, *argv);

    sys_set_audio_settings(&as);
    return (0);
}